

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void * __thiscall asmjit::v1_14::Zone::_alloc(Zone *this,size_t size,size_t alignment)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long extraout_RAX;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t __size;
  
  puVar1 = *(undefined1 **)(this + 0x10);
  puVar2 = *(undefined8 **)(puVar1 + 8);
  uVar8 = 1L << ((byte)this[0x18] & 0x3f);
  if (uVar8 <= alignment) {
    uVar8 = alignment;
  }
  if (puVar2 == (undefined8 *)0x0) {
LAB_0012a7e0:
    lVar3 = *(long *)(this + 0x20);
    uVar7 = (ulong)(byte)this[0x19] + lVar3;
    if ((byte)this[0x1a] <= uVar7) {
      uVar7 = (ulong)(byte)this[0x1a];
    }
    lVar9 = 1L << ((byte)uVar7 & 0x3f);
    lVar4 = 0;
    if (7 < uVar8) {
      lVar4 = uVar8 - 8;
    }
    if ((lVar9 - lVar4) - 0x38U < size) {
      if (size <= -lVar4 - 0x39U) {
        __size = size + lVar4 + 0x18;
        goto LAB_0012a823;
      }
    }
    else {
      __size = lVar9 - 0x20;
LAB_0012a823:
      plVar5 = (long *)malloc(__size);
      if (plVar5 != (long *)0x0) {
        *plVar5 = 0;
        plVar5[1] = 0;
        plVar5[2] = __size - 0x18;
        if (puVar1 != _zeroBlock) {
          *plVar5 = (long)puVar1;
          *(long **)(puVar1 + 8) = plVar5;
          if (puVar2 != (undefined8 *)0x0) {
            plVar5[1] = (long)puVar2;
            *puVar2 = plVar5;
          }
        }
        pvVar6 = (void *)((long)plVar5 + uVar8 + 0x17);
        size = size + (long)(-uVar8 & (ulong)pvVar6);
        *(size_t *)this = size;
        *(size_t *)(this + 8) = __size + (long)plVar5;
        *(long **)(this + 0x10) = plVar5;
        *(long *)(this + 0x20) = lVar3 + 1;
        if (size <= __size + (long)plVar5) {
          return (void *)(-uVar8 & (ulong)pvVar6);
        }
        _alloc();
        lVar3 = extraout_RAX;
        goto LAB_0012a894;
      }
    }
    pvVar6 = (void *)0x0;
  }
  else {
    lVar3 = (long)puVar2 + puVar2[2] + 0x18;
    pvVar6 = (void *)(-uVar8 & (long)puVar2 + uVar8 + 0x17);
    if ((ulong)(lVar3 - (long)pvVar6) < size) goto LAB_0012a7e0;
LAB_0012a894:
    *(undefined8 **)(this + 0x10) = puVar2;
    *(size_t *)this = size + (long)pvVar6;
    *(long *)(this + 8) = lVar3;
  }
  return pvVar6;
}

Assistant:

void* Zone::_alloc(size_t size, size_t alignment) noexcept {
  Block* curBlock = _block;
  Block* next = curBlock->next;

  size_t defaultBlockAlignment = blockAlignment();
  size_t requiredBlockAlignment = Support::max<size_t>(alignment, defaultBlockAlignment);

  // If the `Zone` has been cleared the current block doesn't have to be the last one. Check if there is a block
  // that can be used instead of allocating a new one. If there is a `next` block it's completely unused, we don't
  // have to check for remaining bytes in that case.
  if (next) {
    uint8_t* ptr = Support::alignUp(next->data(), requiredBlockAlignment);
    uint8_t* end = next->data() + next->size;

    if (size <= (size_t)(end - ptr)) {
      _block = next;
      _ptr = ptr + size;
      _end = end;
      return static_cast<void*>(ptr);
    }
  }

  // Calculates the "default" size of a next block - in most cases this would be enough for the allocation. In
  // general we want to gradually increase block size when more and more blocks are allocated until the maximum
  // block size. Since we use shifts (aka log2(size) sizes) we just need block count and minumum/maximum block
  // size shift to calculate the final size.
  size_t defaultBlockSizeShift = Support::min<size_t>(_blockCount + _minimumBlockSizeShift, _maximumBlockSizeShift);
  size_t defaultBlockSize = size_t(1) << defaultBlockSizeShift;

  // Allocate a new block. We have to accommodate all possible overheads so after the memory is allocated and then
  // properly aligned there will be size for the requested memory. In 99.9999% cases this is never a problem, but
  // we must be sure that even rare border cases would allocate properly.
  size_t alignmentOverhead = requiredBlockAlignment - Support::min<size_t>(requiredBlockAlignment, Globals::kAllocAlignment);
  size_t blockSizeOverhead = kBlockSize + Globals::kAllocOverhead + alignmentOverhead;

  // If the requested size is larger than a default calculated block size -> increase block size so the allocation
  // would be enough to fit the requested size.
  size_t finalBlockSize = defaultBlockSize;

  if (ASMJIT_UNLIKELY(size > defaultBlockSize - blockSizeOverhead)) {
    if (ASMJIT_UNLIKELY(size > SIZE_MAX - blockSizeOverhead)) {
      // This would probably never happen in practice - however, it needs to be done to stop malicious cases like
      // `alloc(SIZE_MAX)`.
      return nullptr;
    }
    finalBlockSize = size + alignmentOverhead + kBlockSize;
  }
  else {
    finalBlockSize -= Globals::kAllocOverhead;
  }

  // Allocate new block.
  Block* newBlock = static_cast<Block*>(::malloc(finalBlockSize));

  if (ASMJIT_UNLIKELY(!newBlock)) {
    return nullptr;
  }

  // finalBlockSize includes the struct size, which must be avoided when assigning the size to a newly allocated block.
  size_t realBlockSize = finalBlockSize - kBlockSize;

  // Align the pointer to `minimumAlignment` and adjust the size of this block accordingly. It's the same as using
  // `minimumAlignment - Support::alignUpDiff()`, just written differently.
  newBlock->prev = nullptr;
  newBlock->next = nullptr;
  newBlock->size = realBlockSize;

  if (curBlock != &_zeroBlock) {
    newBlock->prev = curBlock;
    curBlock->next = newBlock;

    // Does only happen if there is a next block, but the requested memory can't fit into it. In this case a new
    // buffer is allocated and inserted between the current block and the next one.
    if (next) {
      newBlock->next = next;
      next->prev = newBlock;
    }
  }

  uint8_t* ptr = Support::alignUp(newBlock->data(), requiredBlockAlignment);
  uint8_t* end = newBlock->data() + realBlockSize;

  _ptr = ptr + size;
  _end = end;
  _block = newBlock;
  _blockCount++;

  ASMJIT_ASSERT(_ptr <= _end);
  return static_cast<void*>(ptr);
}